

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O3

void GEN_CS::gen_cs_example_dm(multi_ex *examples,label *cs_labels)

{
  float fVar1;
  wclass *pwVar2;
  pointer ppeVar3;
  ulong uVar4;
  wclass local_30;
  
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar3) {
    uVar4 = 0;
    do {
      pwVar2 = (ppeVar3[uVar4]->l).cs.costs._begin;
      local_30.x = 0.0;
      local_30.partial_prediction = 0.0;
      local_30.wap_value = 0.0;
      if ((long)(ppeVar3[uVar4]->l).cs.costs._end - (long)pwVar2 == 0x10) {
        fVar1 = pwVar2->x;
        if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
          local_30.x = fVar1;
        }
      }
      local_30.class_index = (uint32_t)uVar4;
      v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,&local_30);
      uVar4 = (ulong)((uint32_t)uVar4 + 1);
      ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(examples->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3));
  }
  return;
}

Assistant:

void gen_cs_example_dm(multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  for (uint32_t i = 0; i < examples.size(); i++)
  {
    CB::label ld = examples[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0., i, 0., 0.};
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
      wc.x = ld.costs[0].cost;
    cs_labels.costs.push_back(wc);
  }
}